

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.h
# Opt level: O0

void __thiscall
kj::HttpHeaders::forEach<kj::(anonymous_namespace)::TestCase162::run()::__0>
          (HttpHeaders *this,anon_class_8_1_658f57d5 *func)

{
  HttpHeaderTable *this_00;
  bool bVar1;
  unsigned_long *puVar2;
  StringPtr *this_01;
  ArrayPtr<const_char> *pAVar3;
  Header *pHVar4;
  HttpHeaderId id;
  Header *header;
  Header *__end2_1;
  Header *__begin2_1;
  Vector<kj::HttpHeaders::Header> *__range2_1;
  undefined1 local_68 [12];
  ArrayPtr<const_char> local_58;
  size_t local_48;
  unsigned_long i;
  Iterator __end2;
  Iterator __begin2;
  Range<unsigned_long> *__range2;
  anon_class_8_1_658f57d5 *func_local;
  HttpHeaders *this_local;
  
  ___begin2 = indices<kj::Array<kj::StringPtr>const&>(&this->indexedHeaders);
  __end2 = Range<unsigned_long>::begin((Range<unsigned_long> *)&__begin2);
  i = (unsigned_long)Range<unsigned_long>::end((Range<unsigned_long> *)&__begin2);
  while (bVar1 = Range<unsigned_long>::Iterator::operator!=(&__end2,(Iterator *)&i), bVar1) {
    puVar2 = Range<unsigned_long>::Iterator::operator*(&__end2);
    local_48 = *puVar2;
    this_01 = Array<kj::StringPtr>::operator[](&this->indexedHeaders,local_48);
    bVar1 = StringPtr::operator!=(this_01,(void *)0x0);
    if (bVar1) {
      this_00 = this->table;
      HttpHeaderId::HttpHeaderId((HttpHeaderId *)local_68,this->table,(uint)local_48);
      id._12_4_ = 0;
      id.table = (HttpHeaderTable *)local_68._0_8_;
      id.id = local_68._8_4_;
      local_58 = (ArrayPtr<const_char>)HttpHeaderTable::idToString(this_00,id);
      pAVar3 = &Array<kj::StringPtr>::operator[](&this->indexedHeaders,local_48)->content;
      anon_unknown_0::TestCase162::run::anon_class_8_1_658f57d5::operator()
                (func,(StringPtr)local_58,(StringPtr)*pAVar3);
    }
    Range<unsigned_long>::Iterator::operator++(&__end2);
  }
  __end2_1 = Vector<kj::HttpHeaders::Header>::begin(&this->unindexedHeaders);
  pHVar4 = Vector<kj::HttpHeaders::Header>::end(&this->unindexedHeaders);
  for (; __end2_1 != pHVar4; __end2_1 = __end2_1 + 1) {
    anon_unknown_0::TestCase162::run::anon_class_8_1_658f57d5::operator()
              (func,(StringPtr)(__end2_1->name).content,(StringPtr)(__end2_1->value).content);
  }
  return;
}

Assistant:

inline void HttpHeaders::forEach(Func&& func) const {
  for (auto i: kj::indices(indexedHeaders)) {
    if (indexedHeaders[i] != nullptr) {
      func(table->idToString(HttpHeaderId(table, i)), indexedHeaders[i]);
    }
  }

  for (auto& header: unindexedHeaders) {
    func(header.name, header.value);
  }
}